

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O1

mraa_gpio_context mraa_gpio_chardev_init(int *pins,int num_pins)

{
  _gpio_group *p_Var1;
  mraa_pininfo_t *pmVar2;
  mraa_pin_t meta;
  uint uVar3;
  mraa_boolean_t mVar4;
  int iVar5;
  mraa_result_t mVar6;
  mraa_gpio_context dev;
  int *piVar7;
  _gpio_group *p_Var8;
  mraa_gpiod_chip_info *__ptr;
  uint *puVar9;
  void *pvVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  mraa_board_t *pmVar14;
  mraa_pin_t *pmVar15;
  int *piVar16;
  char *pcVar17;
  undefined8 *puVar18;
  ulong uVar19;
  size_t __size;
  byte bVar20;
  undefined8 auStackY_128 [7];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 in_stack_ffffffffffffff10 [40];
  undefined1 in_stack_ffffffffffffff3c [12];
  uint in_stack_ffffffffffffff4c;
  undefined1 in_stack_ffffffffffffff68 [12];
  undefined4 local_38;
  
  pmVar14 = plat;
  bVar20 = 0;
  dev = (mraa_gpio_context)calloc(1,0x88);
  if (dev == (mraa_gpio_context)0x0) {
    syslog(2,"[GPIOD_INTERFACE]: Failed to allocate memory for context");
    return (mraa_gpio_context)0x0;
  }
  piVar7 = (int *)malloc((long)num_pins << 2);
  dev->pin_to_gpio_table = piVar7;
  if (piVar7 == (int *)0x0) goto LAB_0010a853;
  uVar3 = mraa_get_number_of_gpio_chips();
  dev->num_chips = uVar3;
  if (uVar3 == 0) goto LAB_0010a866;
  dev->num_pins = num_pins;
  p_Var8 = (_gpio_group *)calloc((ulong)uVar3,0x40);
  if (p_Var8 == (_gpio_group *)0x0) {
LAB_0010a853:
    pcVar17 = "[GPIOD_INTERFACE]: Failed to allocate memory for internal member";
  }
  else {
    dev->gpio_group = p_Var8;
    puVar9 = &p_Var8->gpio_chip;
    uVar11 = 0;
    do {
      *puVar9 = (uint)uVar11;
      *(uint **)(puVar9 + 3) = (uint *)0x0;
      uVar11 = uVar11 + 1;
      puVar9 = puVar9 + 0x10;
    } while (uVar3 != uVar11);
    if (0 < num_pins) {
      uVar11 = (ulong)(uint)num_pins;
      uVar19 = 0;
      do {
        piVar7 = pins;
        mVar4 = mraa_is_sub_platform_id(pins[uVar19]);
        if (mVar4 != 0) {
          syslog(5,"[GPIOD_INTERFACE]: init: Using sub platform for %d",(ulong)(uint)pins[uVar19]);
          pmVar14 = pmVar14->sub_platform;
          uVar3 = pins[uVar19];
          if (pmVar14 != (mraa_board_t *)0x0) {
            iVar5 = mraa_get_sub_platform_index(uVar3);
            pins[uVar19] = iVar5;
            goto LAB_0010a5dc;
          }
          pcVar17 = "[GPIOD_INTERFACE]: init: Sub platform not initialised for pin %d";
LAB_0010a8c9:
          uVar13 = (ulong)uVar3;
LAB_0010a8ce:
          syslog(3,pcVar17,uVar13);
          goto LAB_0010a866;
        }
LAB_0010a5dc:
        uVar13 = (ulong)pins[uVar19];
        if (((long)uVar13 < 0) || (pmVar14->phy_pin_count <= pins[uVar19])) {
          syslog(3,"[GPIOD_INTERFACE]: init: pin %d beyond platform pin count (%d)",uVar13,
                 (ulong)(uint)pmVar14->phy_pin_count);
          goto LAB_0010a866;
        }
        pmVar2 = pmVar14->pins;
        if (((uint)pmVar2[uVar13].capabilities & 2) == 0) {
          pcVar17 = "[GPIOD_INTERFACE]: init: pin %d not capable of gpio";
          goto LAB_0010a8ce;
        }
        if (pmVar2[uVar13].gpio.mux_total != 0) {
          pmVar15 = &pmVar2[uVar13].gpio;
          piVar16 = (int *)&stack0xffffffffffffff68;
          for (lVar12 = 0x19; lVar12 != 0; lVar12 = lVar12 + -1) {
            *piVar16 = pmVar15->pinmap;
            pmVar15 = (mraa_pin_t *)((long)pmVar15 + (ulong)bVar20 * -8 + 4);
            piVar16 = piVar16 + (ulong)bVar20 * -2 + 1;
          }
          piVar16 = (int *)&stack0xffffffffffffff68;
          puVar18 = auStackY_128;
          for (lVar12 = 0xc; lVar12 != 0; lVar12 = lVar12 + -1) {
            *puVar18 = *(undefined8 *)piVar16;
            piVar16 = piVar16 + ((ulong)bVar20 * -2 + 1) * 2;
            puVar18 = puVar18 + (ulong)bVar20 * -2 + 1;
          }
          meta.mux[2].pin = local_38;
          auVar21 = in_stack_ffffffffffffff10._12_12_;
          auVar22 = in_stack_ffffffffffffff10._24_12_;
          meta.pinmap = in_stack_ffffffffffffff10._0_4_;
          meta.parent_id = in_stack_ffffffffffffff10._4_4_;
          meta.mux_total = in_stack_ffffffffffffff10._8_4_;
          meta.mux[0].pincmd = auVar21._0_4_;
          meta.mux[0].pin = auVar21._4_4_;
          meta.mux[0].value = auVar21._8_4_;
          meta.mux[1].pincmd = auVar22._0_4_;
          meta.mux[1].pin = auVar22._4_4_;
          meta.mux[1].value = auVar22._8_4_;
          meta.mux[2].pincmd = in_stack_ffffffffffffff10._36_4_;
          meta.mux[2].value = in_stack_ffffffffffffff3c._0_4_;
          meta.mux[3].pincmd = in_stack_ffffffffffffff3c._4_4_;
          meta.mux[3].pin = in_stack_ffffffffffffff3c._8_4_;
          meta.mux[3].value = num_pins;
          meta.mux[4].pincmd = in_stack_ffffffffffffff4c;
          meta.mux[4]._4_8_ = p_Var8;
          meta.mux[5].pincmd = (int)uVar11;
          meta.mux[5].pin = (int)(uVar11 >> 0x20);
          meta._80_8_ = piVar7;
          meta.complex_cap = (mraa_pin_cap_complex_t)in_stack_ffffffffffffff68._0_4_;
          meta.gpio_chip = in_stack_ffffffffffffff68._4_4_;
          meta.gpio_line = in_stack_ffffffffffffff68._8_4_;
          mVar6 = mraa_setup_mux_mapped(meta);
          if (mVar6 != MRAA_SUCCESS) {
            uVar3 = pins[uVar19];
            pcVar17 = "[GPIOD_INTERFACE]: init: unable to setup muxes for pin %d";
            goto LAB_0010a8c9;
          }
        }
        uVar3 = pmVar14->pins[pins[uVar19]].gpio.gpio_chip;
        in_stack_ffffffffffffff4c = pmVar14->pins[pins[uVar19]].gpio.gpio_line;
        dev->pin_to_gpio_table[uVar19] = uVar3;
        p_Var1 = p_Var8 + (int)uVar3;
        pins = piVar7;
        if (p_Var8[(int)uVar3].is_required == 0) {
          __ptr = mraa_get_chip_info_by_number(uVar3);
          if (__ptr == (mraa_gpiod_chip_info *)0x0) {
            syslog(3,"[GPIOD_INTERFACE]: error getting gpio_chip_info for chip %d",(ulong)uVar3);
            mraa_gpio_close(dev);
            return (mraa_gpio_context)0x0;
          }
          p_Var1->dev_fd = __ptr->chip_fd;
          p_Var1->is_required = 1;
          p_Var1->gpiod_handle = -1;
          free(__ptr);
          pins = piVar7;
        }
        uVar3 = p_Var1->num_gpio_lines;
        puVar9 = (uint *)realloc(p_Var1->gpio_lines,(long)(int)uVar3 * 4 + 4);
        p_Var1->gpio_lines = puVar9;
        if (puVar9 == (uint *)0x0) {
          syslog(2,"[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
          mraa_gpio_close(dev);
          return (mraa_gpio_context)0x0;
        }
        puVar9[(int)uVar3] = in_stack_ffffffffffffff4c;
        p_Var1->num_gpio_lines = p_Var1->num_gpio_lines + 1;
        uVar19 = uVar19 + 1;
      } while (uVar11 != uVar19);
    }
    uVar3 = dev->num_chips;
    if ((ulong)uVar3 != 0) {
      lVar12 = 0;
      do {
        uVar11 = (ulong)*(uint *)((long)&p_Var8->num_gpio_lines + lVar12);
        pvVar10 = calloc(uVar11,1);
        *(void **)((long)&p_Var8->rw_values + lVar12) = pvVar10;
        if (pvVar10 == (void *)0x0) goto LAB_0010a853;
        pvVar10 = calloc(uVar11,4);
        *(void **)((long)&p_Var8->gpio_group_to_pins_table + lVar12) = pvVar10;
        if (pvVar10 == (void *)0x0) goto LAB_0010a853;
        *(undefined8 *)((long)&p_Var8->event_handles + lVar12) = 0;
        lVar12 = lVar12 + 0x40;
      } while ((ulong)uVar3 << 6 != lVar12);
    }
    pvVar10 = calloc((ulong)dev->num_chips,4);
    if (pvVar10 != (void *)0x0) {
      if (0 < num_pins) {
        piVar7 = dev->pin_to_gpio_table;
        uVar11 = 0;
        do {
          lVar12 = (long)piVar7[uVar11];
          iVar5 = *(int *)((long)pvVar10 + lVar12 * 4);
          p_Var8[lVar12].gpio_group_to_pins_table[iVar5] = (uint)uVar11;
          *(int *)((long)pvVar10 + lVar12 * 4) = iVar5 + 1;
          uVar11 = uVar11 + 1;
        } while ((uint)num_pins != uVar11);
      }
      free(pvVar10);
      __size = (ulong)dev->num_pins << 2;
      piVar7 = (int *)malloc(__size);
      dev->provided_pins = piVar7;
      if (piVar7 != (int *)0x0) {
        memcpy(piVar7,pins,__size);
        dev->events = (mraa_gpio_events_t)0x0;
        return dev;
      }
      goto LAB_0010a853;
    }
    pcVar17 = "[GPIOD_INTERFACE]: Failed to allocate memory for local variable";
  }
  syslog(2,pcVar17);
LAB_0010a866:
  mraa_gpio_close(dev);
  return (mraa_gpio_context)0x0;
}

Assistant:

mraa_gpio_context
mraa_gpio_chardev_init(int pins[], int num_pins)
{
    int chip_id, line_offset;
    mraa_gpio_context dev;
    mraa_gpiod_group_t gpio_group;

    mraa_board_t* board = plat;

    dev = (mraa_gpio_context) calloc(1, sizeof(struct _gpio));
    if (dev == NULL) {
        syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for context");
        return NULL;
    }

    dev->pin_to_gpio_table = malloc(num_pins * sizeof(int));
    if (dev->pin_to_gpio_table == NULL) {
        syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
        mraa_gpio_close(dev);
        return NULL;
    }

    dev->num_chips = mraa_get_number_of_gpio_chips();
    if (dev->num_chips <= 0) {
        mraa_gpio_close(dev);
        return NULL;
    }

    dev->num_pins = num_pins;

    gpio_group = calloc(dev->num_chips, sizeof(struct _gpio_group));
    if (gpio_group == NULL) {
        syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
        mraa_gpio_close(dev);
        return NULL;
    }

    dev->gpio_group = gpio_group;

    for (int i = 0; i < dev->num_chips; ++i) {
        gpio_group[i].gpio_chip = i;
        /* Just to be sure realloc has the desired behaviour. */
        gpio_group[i].gpio_lines = NULL;
    }

    for (int i = 0; i < num_pins; ++i) {
        if (mraa_is_sub_platform_id(pins[i])) {
            syslog(LOG_NOTICE, "[GPIOD_INTERFACE]: init: Using sub platform for %d", pins[i]);
            board = board->sub_platform;
            if (board == NULL) {
                syslog(LOG_ERR, "[GPIOD_INTERFACE]: init: Sub platform not initialised for pin %d", pins[i]);
                mraa_gpio_close(dev);
                return NULL;
            }
            pins[i] = mraa_get_sub_platform_index(pins[i]);
        }

        if (pins[i] < 0 || pins[i] >= board->phy_pin_count) {
            syslog(LOG_ERR, "[GPIOD_INTERFACE]: init: pin %d beyond platform pin count (%d)",
                   pins[i], board->phy_pin_count);
            mraa_gpio_close(dev);
            return NULL;
        }

        if (board->pins[pins[i]].capabilities.gpio != 1) {
            syslog(LOG_ERR, "[GPIOD_INTERFACE]: init: pin %d not capable of gpio", pins[i]);
            mraa_gpio_close(dev);
            return NULL;
        }

        if (board->pins[pins[i]].gpio.mux_total > 0) {
            if (mraa_setup_mux_mapped(board->pins[pins[i]].gpio) != MRAA_SUCCESS) {
                syslog(LOG_ERR, "[GPIOD_INTERFACE]: init: unable to setup muxes for pin %d", pins[i]);
                mraa_gpio_close(dev);
                return NULL;
            }
        }

        chip_id = board->pins[pins[i]].gpio.gpio_chip;
        line_offset = board->pins[pins[i]].gpio.gpio_line;

        /* Map pin to _gpio_group structure. */
        dev->pin_to_gpio_table[i] = chip_id;

        if (!gpio_group[chip_id].is_required) {
            mraa_gpiod_chip_info* cinfo = mraa_get_chip_info_by_number(chip_id);
            if (!cinfo) {
                syslog(LOG_ERR, "[GPIOD_INTERFACE]: error getting gpio_chip_info for chip %d", chip_id);
                mraa_gpio_close(dev);
                return NULL;
            }

            gpio_group[chip_id].dev_fd = cinfo->chip_fd;
            gpio_group[chip_id].is_required = 1;
            gpio_group[chip_id].gpiod_handle = -1;

            free(cinfo);
        }

        int line_in_group;
        line_in_group = gpio_group[chip_id].num_gpio_lines;
        gpio_group[chip_id].gpio_lines =
        realloc(gpio_group[chip_id].gpio_lines, (line_in_group + 1) * sizeof(unsigned int));
        if (gpio_group[chip_id].gpio_lines == NULL) {
            syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
            mraa_gpio_close(dev);
            return NULL;
        }

        gpio_group[chip_id].gpio_lines[line_in_group] = line_offset;
        gpio_group[chip_id].num_gpio_lines++;
    }

    /* Initialize rw_values for read / write multiple functions.
     * Also, allocate memory for inverse map: */
    for (int i = 0; i < dev->num_chips; ++i) {
        gpio_group[i].rw_values = calloc(gpio_group[i].num_gpio_lines, sizeof(unsigned char));
        if (gpio_group[i].rw_values == NULL) {
            syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
            mraa_gpio_close(dev);
            return NULL;
        }

        gpio_group[i].gpio_group_to_pins_table = calloc(gpio_group[i].num_gpio_lines, sizeof(int));
        if (gpio_group[i].gpio_group_to_pins_table == NULL) {
            syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
            mraa_gpio_close(dev);
            return NULL;
        }

        /* Set event handle arrays for all lines contained on a chip to NULL. */
        gpio_group[i].event_handles = NULL;
    }

    /* Finally map the inverse relation between a gpio group and its original pin numbers
     * provided by user. */
    int* counters = calloc(dev->num_chips, sizeof(int));
    if (counters == NULL) {
        syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for local variable");
        mraa_gpio_close(dev);
        return NULL;
    }

    for (int i = 0; i < num_pins; ++i) {
        int chip = dev->pin_to_gpio_table[i];
        gpio_group[chip].gpio_group_to_pins_table[counters[chip]] = i;
        counters[chip]++;
    }
    free(counters);

    /* Save the provided array from the user to our internal structure. */
    dev->provided_pins = malloc(dev->num_pins * sizeof(int));
    if (dev->provided_pins == NULL) {
        syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
        mraa_gpio_close(dev);
        return NULL;
    }

    memcpy(dev->provided_pins, pins, dev->num_pins * sizeof(int));

    /* Initialize events array. */
    dev->events = NULL;

    return dev;
}